

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recycling_allocator.hpp
# Opt level: O2

reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor> *
__thiscall
asio::detail::
recycling_allocator<asio::detail::reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
::allocate(recycling_allocator<asio::detail::reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>,_asio::detail::thread_info_base::default_tag>
           *this,size_t n)

{
  reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
  *prVar1;
  undefined8 uVar2;
  long *in_FS_OFFSET;
  
  if (*(long *)(*in_FS_OFFSET + -0x13d8) == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = *(undefined8 *)(*(long *)(*in_FS_OFFSET + -0x13d8) + 8);
  }
  prVar1 = (reactive_socket_connect_op<std::function<void_(const_std::error_code_&)>,_asio::any_io_executor>
            *)thread_info_base::allocate<asio::detail::thread_info_base::default_tag>
                        (uVar2,n * 0xa0,8);
  return prVar1;
}

Assistant:

T* allocate(std::size_t n)
  {
#if !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = thread_info_base::allocate(Purpose(),
        thread_context::top_of_thread_call_stack(),
        sizeof(T) * n, alignof(T));
#else // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    void* p = asio::aligned_new(align, s);
#endif // !defined(ASIO_DISABLE_SMALL_BLOCK_RECYCLING)
    return static_cast<T*>(p);
  }